

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_fails(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  
  init_process_options("",fail_cb);
  *options.args = "program-that-had-better-not-exist";
  options.file = "program-that-had-better-not-exist";
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if ((iVar1 == -0xd) || (iVar1 == -2)) {
    iVar1 = uv_is_active(&process);
    if (iVar1 == 0) {
      uv_close(&process,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_run(uVar2,0);
      if (iVar1 == 0) {
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uVar2 = 199;
      }
      else {
        pcVar3 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uVar2 = 0xc5;
      }
    }
    else {
      pcVar3 = "0 == uv_is_active((uv_handle_t*) &process)";
      uVar2 = 0xc3;
    }
  }
  else {
    pcVar3 = "r == UV_ENOENT || r == UV_EACCES";
    uVar2 = 0xc2;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(spawn_fails) {
  int r;

  init_process_options("", fail_cb);
  options.file = options.args[0] = "program-that-had-better-not-exist";

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == UV_ENOENT || r == UV_EACCES);
  ASSERT(0 == uv_is_active((uv_handle_t*) &process));
  uv_close((uv_handle_t*) &process, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}